

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldDescriptorProto::MergeFrom
          (FieldDescriptorProto *this,FieldDescriptorProto *from)

{
  byte bVar1;
  int32 iVar2;
  char cVar3;
  uint uVar4;
  LogMessage *other;
  FieldOptions *this_00;
  FieldOptions *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0xb7a);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  bVar1 = (byte)from->_has_bits_[0];
  uVar4 = (uint)bVar1;
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      set_name(this,from->name_);
      uVar4 = from->_has_bits_[0];
    }
    if ((uVar4 & 2) != 0) {
      iVar2 = from->number_;
      this->_has_bits_[0] = this->_has_bits_[0] | 2;
      this->number_ = iVar2;
      uVar4 = from->_has_bits_[0];
    }
    if ((uVar4 & 4) != 0) {
      set_label(this,from->label_);
      uVar4 = from->_has_bits_[0];
    }
    if ((uVar4 & 8) != 0) {
      set_type(this,from->type_);
      uVar4 = from->_has_bits_[0];
    }
    if ((uVar4 & 0x10) != 0) {
      set_type_name(this,from->type_name_);
      uVar4 = from->_has_bits_[0];
    }
    if ((uVar4 & 0x20) != 0) {
      set_extendee(this,from->extendee_);
      uVar4 = from->_has_bits_[0];
    }
    cVar3 = (char)uVar4;
    if ((uVar4 & 0x40) != 0) {
      set_default_value(this,from->default_value_);
      cVar3 = (char)from->_has_bits_[0];
    }
    if (cVar3 < '\0') {
      this_00 = mutable_options(this);
      from_00 = from->options_;
      if (from_00 == (FieldOptions *)0x0) {
        from_00 = *(FieldOptions **)(default_instance_ + 0x38);
      }
      FieldOptions::MergeFrom(this_00,from_00);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void FieldDescriptorProto::MergeFrom(const FieldDescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_number()) {
      set_number(from.number());
    }
    if (from.has_label()) {
      set_label(from.label());
    }
    if (from.has_type()) {
      set_type(from.type());
    }
    if (from.has_type_name()) {
      set_type_name(from.type_name());
    }
    if (from.has_extendee()) {
      set_extendee(from.extendee());
    }
    if (from.has_default_value()) {
      set_default_value(from.default_value());
    }
    if (from.has_options()) {
      mutable_options()->::google::protobuf::FieldOptions::MergeFrom(from.options());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}